

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall
cfd::core::Psbt::SetTxOutData
          (Psbt *this,uint32_t index,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  CfdException *pCVar7;
  undefined4 in_register_00000034;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script new_redeem_script;
  Txid txid;
  ByteData256 empty_bytes;
  Script script;
  int local_15c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  Script local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  Script local_f0;
  Txid local_b8;
  ByteData local_98;
  ByteData256 local_80;
  Script local_68;
  
  uVar3 = (ulong)index;
  (*this->_vptr_Psbt[3])(this,CONCAT44(in_register_00000034,index),0xb8b,"SetTxOutData");
  pvVar1 = this->wally_psbt_pointer_;
  lVar2 = *(long *)(*(long *)((long)pvVar1 + 8) + 0x20);
  ByteData::ByteData((ByteData *)&local_f0,*(uint8_t **)(lVar2 + 8 + uVar3 * 0x70),
                     *(uint32_t *)(lVar2 + 0x10 + uVar3 * 0x70));
  Script::Script(&local_68,(ByteData *)&local_f0);
  if (local_f0._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_f0._vptr_Script);
  }
  ByteData256::ByteData256(&local_80);
  Txid::Txid(&local_b8,&local_80);
  Script::Script(&local_f0,redeem_script);
  bVar5 = ValidatePsbtUtxo(&local_b8,index,&local_68,redeem_script,key_list,&local_f0);
  bVar6 = Script::IsEmpty(&local_f0);
  if (!bVar6) {
    Script::GetData((ByteData *)&local_140,&local_f0);
    ByteData::GetBytes(&local_158,(ByteData *)&local_140);
    if (local_140._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_140._vptr_Script);
    }
    if (bVar5) {
      bVar5 = Script::IsP2wpkhScript(&local_f0);
      if (!bVar5) {
        local_15c = wally_psbt_output_set_witness_script
                              (uVar3 * 0xd0 + *(long *)((long)pvVar1 + 0x28),
                               local_158.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        if (local_15c != 0) {
          local_140._vptr_Script = (_func_int **)0x21e190;
          local_140.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0xba0;
          local_140.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "SetTxOutData";
          logger::log<int&>((CfdSourceLocation *)&local_140,kCfdLogLevelWarning,
                            "wally_psbt_output_set_witness_script NG[{}]",&local_15c);
          pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
          local_140._vptr_Script =
               (_func_int **)
               &local_140.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,"psbt add output witness script error.","");
          CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_140);
          __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
        }
        bVar5 = Script::IsP2shScript(&local_68);
        if (bVar5) {
          ScriptUtil::CreateP2wshLockingScript(&local_140,&local_f0);
          Script::GetData(&local_98,&local_140);
          ByteData::GetBytes(&local_108,&local_98);
          puVar4 = local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar4 != (pointer)0x0) {
            operator_delete(puVar4);
          }
          if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          Script::~Script(&local_140);
        }
        else if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish !=
                 local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start) {
          local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
    }
    if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_15c = wally_psbt_output_set_redeem_script
                            (uVar3 * 0xd0 + *(long *)((long)pvVar1 + 0x28),
                             local_158.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)local_158.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_158.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      if (local_15c != 0) {
        local_140._vptr_Script = (_func_int **)0x21e190;
        local_140.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0xbb2;
        local_140.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxOutData";
        logger::log<int&>((CfdSourceLocation *)&local_140,kCfdLogLevelWarning,
                          "wally_psbt_output_set_redeem_script NG[{}]",&local_15c);
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        local_140._vptr_Script =
             (_func_int **)
             &local_140.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"psbt add output redeem script error.","");
        CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_140);
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    SetKeyPathMap(key_list,(wally_map *)(*(long *)((long)pvVar1 + 0x28) + uVar3 * 0xd0 + 0x20));
    local_15c = wally_map_sort(*(long *)((long)pvVar1 + 0x28) + uVar3 * 0xd0 + 0x20,0);
    if (local_15c != 0) {
      local_140._vptr_Script = (_func_int **)0x21e190;
      local_140.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xbbd;
      local_140.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = "SetTxOutData";
      logger::log<int&>((CfdSourceLocation *)&local_140,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                        &local_15c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_140._vptr_Script =
           (_func_int **)
           &local_140.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"psbt output sort keypaths error.","");
      CfdException::CfdException(pCVar7,kCfdInternalError,(string *)&local_140);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  Script::~Script(&local_f0);
  local_b8._vptr_Txid = (_func_int **)&PTR__Txid_0025aa88;
  if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Script::~Script(&local_68);
  return;
}

Assistant:

void Psbt::SetTxOutData(
    uint32_t index, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  struct wally_tx_output *txout = &psbt_pointer->tx->outputs[index];
  Script script(
      ByteData(txout->script, static_cast<uint32_t>(txout->script_len)));
  ByteData256 empty_bytes;
  Txid txid(empty_bytes);
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, index, script, redeem_script, key_list, &new_redeem_script);

  int ret;
  if (!new_redeem_script.IsEmpty()) {
    auto script_val = new_redeem_script.GetData().GetBytes();
    if (is_witness && (!new_redeem_script.IsP2wpkhScript())) {
      ret = wally_psbt_output_set_witness_script(
          &psbt_pointer->outputs[index], script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_output_set_witness_script NG[{}]",
            ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add output witness script error.");
      }
      if (script.IsP2shScript()) {
        script_val = ScriptUtil::CreateP2wshLockingScript(new_redeem_script)
                         .GetData()
                         .GetBytes();
      } else {
        script_val.clear();
      }
    }
    if (!script_val.empty()) {
      ret = wally_psbt_output_set_redeem_script(
          &psbt_pointer->outputs[index], script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_output_set_redeem_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add output redeem script error.");
      }
    }
  }

  if (!key_list.empty()) {
    SetKeyPathMap(key_list, &psbt_pointer->outputs[index].keypaths);
    ret = wally_map_sort(&psbt_pointer->outputs[index].keypaths, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(
          kCfdInternalError, "psbt output sort keypaths error.");
    }
  }
}